

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale.h
# Opt level: O0

undefined8
fmt::v5::internal::vformat<wchar_t>
          (locale *loc,basic_string_view<wchar_t> format_str,
          basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          args)

{
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  iterator this;
  unsigned_long_long in_RCX;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *in_RDX;
  undefined8 in_RDI;
  basic_buffer<wchar_t> *in_R9;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> buffer;
  allocator<wchar_t> *in_stack_fffffffffffff778;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *in_stack_fffffffffffff780;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_2
  in_stack_fffffffffffff7c8;
  basic_string_view<wchar_t> in_stack_fffffffffffff7d0;
  
  std::allocator<wchar_t>::allocator();
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::basic_memory_buffer
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&stack0xfffffffffffff7df);
  args_00.field_1.args_ = in_stack_fffffffffffff7c8.args_;
  args_00.types_ = in_RCX;
  this = vformat_to<wchar_t>((locale *)in_RDX,in_R9,in_stack_fffffffffffff7d0,args_00);
  to_string<wchar_t,500ul>(in_RDX);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
            ((basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)this.container);
  return in_RDI;
}

Assistant:

std::basic_string<Char> vformat(
    const std::locale &loc, basic_string_view<Char> format_str,
    basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(loc, buffer, format_str, args);
  return fmt::to_string(buffer);
}